

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O0

bool __thiscall cmSetPropertyCommand::HandleTarget(cmSetPropertyCommand *this,cmTarget *target)

{
  string *prop;
  char *local_28;
  char *value;
  string *name;
  cmTarget *target_local;
  cmSetPropertyCommand *this_local;
  
  prop = &this->PropertyName;
  local_28 = (char *)std::__cxx11::string::c_str();
  if ((this->Remove & 1U) != 0) {
    local_28 = (char *)0x0;
  }
  if ((this->AppendMode & 1U) == 0) {
    cmTarget::SetProperty(target,prop,local_28);
  }
  else {
    cmTarget::AppendProperty(target,prop,local_28,(bool)(this->AppendAsString & 1));
  }
  cmTarget::CheckProperty(target,prop,(this->super_cmCommand).Makefile);
  return true;
}

Assistant:

bool cmSetPropertyCommand::HandleTarget(cmTarget* target)
{
  // Set or append the property.
  std::string const& name = this->PropertyName;
  const char* value = this->PropertyValue.c_str();
  if (this->Remove) {
    value = CM_NULLPTR;
  }
  if (this->AppendMode) {
    target->AppendProperty(name, value, this->AppendAsString);
  } else {
    target->SetProperty(name, value);
  }

  // Check the resulting value.
  target->CheckProperty(name, this->Makefile);

  return true;
}